

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodetree.c
# Opt level: O2

err_t AddChild(nodetree *p,nodetree *Child,nodetree *Before)

{
  nodetree *pnVar1;
  nodetree **ppnVar2;
  nodetree **ppnVar3;
  
  ppnVar2 = &p->Children;
  do {
    ppnVar3 = ppnVar2;
    pnVar1 = *ppnVar3;
    if (pnVar1 == (nodetree *)0x0) break;
    ppnVar2 = &pnVar1->Next;
  } while (pnVar1 != Before);
  Child->Parent = p;
  Child->Next = Before;
  *ppnVar3 = Child;
  return 0;
}

Assistant:

static err_t AddChild(nodetree* p,nodetree* Child, nodetree* Before)
{
    nodetree** i;

    for (i=&p->Children;*i;i=&(*i)->Next)
        if (*i == Before)
            break;

    Child->Parent = p;
    Child->Next = Before;
    *i = Child;

    return ERR_NONE;
}